

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O2

void FRandom::StaticWriteRNGState(FSerializer *arc)

{
  FRandom *pFVar1;
  bool bVar2;
  FSerializer *pFVar3;
  FRandom **ppFVar4;
  
  FSerializer::operator()(arc,"rngseed",&rngseed);
  bVar2 = FSerializer::BeginArray(arc,"rngs");
  if (bVar2) {
    ppFVar4 = &RNGList;
    while (pFVar1 = *ppFVar4, pFVar1 != (FRandom *)0x0) {
      if (pFVar1->NameCRC != 0) {
        bVar2 = FSerializer::BeginObject(arc,(char *)0x0);
        if (bVar2) {
          pFVar3 = FSerializer::operator()(arc,"crc",&pFVar1->NameCRC);
          pFVar3 = FSerializer::operator()(pFVar3,"index",&pFVar1->idx);
          pFVar3 = FSerializer::Array<unsigned_int>(pFVar3,"u",(pFVar1->sfmt).u,0x14,false);
          FSerializer::EndObject(pFVar3);
        }
      }
      ppFVar4 = &pFVar1->Next;
    }
    FSerializer::EndArray(arc);
    return;
  }
  return;
}

Assistant:

void FRandom::StaticWriteRNGState (FSerializer &arc)
{
	FRandom *rng;

	arc("rngseed", rngseed);

	if (arc.BeginArray("rngs"))
	{
		for (rng = FRandom::RNGList; rng != NULL; rng = rng->Next)
		{
			// Only write those RNGs that have names
			if (rng->NameCRC != 0)
			{
				if (arc.BeginObject(nullptr))
				{
					arc("crc", rng->NameCRC)
						("index", rng->idx)
						.Array("u", rng->sfmt.u, SFMT::N32)
						.EndObject();
				}
			}
		}
		arc.EndArray();
	}
}